

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall backend::codegen::RegAllocator::display_active_regs(RegAllocator *this)

{
  _Hash_node_base *p_Var1;
  _List_node_base *p_Var2;
  ostream *poVar3;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *plVar4;
  Tag *in_RSI;
  char *function;
  ostream local_119;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  RegAllocator *local_d8;
  undefined **local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8;
  Function local_a0;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_119 = (ostream)0x0;
  AixLog::operator<<(&local_119,(Severity *)in_RSI);
  local_d0 = &PTR__Tag_001edee0;
  local_c0 = 0;
  local_b8 = 0;
  local_a8 = 1;
  local_c8 = &local_b8;
  AixLog::operator<<((ostream *)&local_d0,in_RSI);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)in_RSI);
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"display_active_regs","");
  function = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
  if (local_f8 == &local_e8) {
    local_a0.name.field_2._8_8_ = local_e8._8_8_;
  }
  else {
    local_a0.name._M_dataplus._M_p = (pointer)local_f8;
  }
  local_a0.file._M_dataplus._M_p = (pointer)&local_a0.file.field_2;
  local_a0.name._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  if (local_118 == &local_108) {
    local_a0.file.field_2._8_8_ = local_108._8_8_;
  }
  else {
    local_a0.file._M_dataplus._M_p = (pointer)local_118;
  }
  local_a0.file._M_string_length = local_110;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_a0.line = 200;
  local_a0.is_null_ = false;
  local_118 = &local_108;
  local_f8 = &local_e8;
  AixLog::operator<<((ostream *)&local_a0,(Function *)function);
  AixLog::Function::~Function(&local_a0);
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_d0 = &PTR__Tag_001edee0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"active: ",8);
  local_d8 = this;
  for (p_Var1 = (this->active)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->[",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; ",2);
  }
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"map: ",5);
  plVar4 = &local_d8->active_reg_map;
  for (p_Var2 = (local_d8->active_reg_map).
                super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)plVar4;
      p_Var2 = p_Var2->_M_next) {
    arm::display_reg_name((ostream *)&std::clog,*(Reg *)&p_Var2[1]._M_next);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"->",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; ",2);
  }
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

void display_active_regs() {
    auto &trace = LOG(TRACE);
    trace << "active: ";
    for (auto x : active) {
      trace << x.first << "->[" << x.second.start << "," << x.second.end << "]"
            << "; ";
    }
    trace << std::endl;
    trace << "map: ";
    for (auto x : active_reg_map) {
      display_reg_name(trace, x.first);
      trace << "->" << x.second << "; ";
    }
    trace << std::endl;
  }